

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t
exr_attr_set_channels(exr_context_t ctxt,int part_index,char *name,exr_attr_chlist_t *channels)

{
  uint nchans;
  exr_attr_chlist_entry_t *peVar1;
  exr_attr_chlist_t *peVar2;
  int iVar3;
  exr_result_t eVar4;
  long lVar5;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attr_chlist_t clist;
  
  attr = (exr_attribute_t *)0x0;
  if ((name != (char *)0x0) && (iVar3 = strcmp(name,"channels"), iVar3 == 0)) {
    eVar4 = exr_set_channels(ctxt,part_index,channels);
    return eVar4;
  }
  if (ctxt == (exr_context_t)0x0) {
    iVar3 = 2;
  }
  else {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar4 = (**(code **)(ctxt + 0x48))
                        (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
      return eVar4;
    }
    if (*ctxt != (_priv_exr_context_t)0x1) {
      eVar4 = (**(code **)(ctxt + 0x38))(ctxt,8);
      return eVar4;
    }
    if (channels == (exr_attr_chlist_t *)0x0) {
      eVar4 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"No input values for setting \'%s\', type \'chlist\'",name,
                         *(code **)(ctxt + 0x48));
      return eVar4;
    }
    list = (exr_attribute_list_t *)
           (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
    iVar3 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
    if (iVar3 == 0xf) {
      iVar3 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_CHLIST,0,(uint8_t **)0x0,&attr);
    }
    if (iVar3 == 0) {
      nchans = channels->num_channels;
      iVar3 = exr_attr_chlist_init(ctxt,&clist,nchans);
      if (iVar3 == 0) {
        if ((int)nchans < 1) {
          nchans = 0;
        }
        lVar5 = 0;
        do {
          if ((ulong)nchans * 0x20 + 0x20 == lVar5 + 0x20) {
            exr_attr_chlist_destroy(ctxt,(attr->field_6).chlist);
            peVar2 = (attr->field_6).chlist;
            peVar2->num_channels = clist.num_channels;
            peVar2->num_alloced = clist.num_alloced;
            peVar2->entries = clist.entries;
            return 0;
          }
          peVar1 = channels->entries;
          iVar3 = exr_attr_chlist_add_with_length
                            (ctxt,&clist,*(char **)(peVar1->reserved + lVar5 + -0xd),
                             *(int32_t *)(peVar1->reserved + lVar5 + -0x15),
                             *(exr_pixel_type_t *)(peVar1->reserved + lVar5 + -5),
                             (uint)peVar1->reserved[lVar5 + -1],
                             *(int32_t *)(peVar1->reserved + lVar5 + 3),
                             *(int32_t *)(peVar1->reserved + lVar5 + 7));
          lVar5 = lVar5 + 0x20;
        } while (iVar3 == 0);
        exr_attr_chlist_destroy(ctxt,&clist);
      }
    }
  }
  return iVar3;
}

Assistant:

exr_result_t
exr_attr_set_channels (
    exr_context_t            ctxt,
    int                      part_index,
    const char*              name,
    const exr_attr_chlist_t* channels)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    if (name && 0 == strcmp (name, EXR_REQ_CHANNELS_STR))
        return exr_set_channels (ctxt, part_index, channels);

    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    /* do not support updating channels during update operation... */
    if (pctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (!channels)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input values for setting '%s', type 'chlist'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        rv = exr_attr_list_add (
            ctxt, &(part->attributes), name, EXR_ATTR_CHLIST, 0, NULL, &(attr));
    }

    if (rv == EXR_ERR_SUCCESS)
    {
        exr_attr_chlist_t clist;
        int               numchans;

        if (!channels)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "No channels provided for channel list"));

        numchans = channels->num_channels;
        rv       = exr_attr_chlist_init (ctxt, &clist, numchans);
        if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        for (int c = 0; c < numchans; ++c)
        {
            const exr_attr_chlist_entry_t* cur = channels->entries + c;

            rv = exr_attr_chlist_add_with_length (
                ctxt,
                &clist,
                cur->name.str,
                cur->name.length,
                cur->pixel_type,
                (exr_perceptual_treatment_t) cur->p_linear,
                cur->x_sampling,
                cur->y_sampling);
            if (rv != EXR_ERR_SUCCESS)
            {
                exr_attr_chlist_destroy (ctxt, &clist);
                return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
            }
        }

        exr_attr_chlist_destroy (ctxt, attr->chlist);
        *(attr->chlist) = clist;
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}